

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lup_matrix.cpp
# Opt level: O0

Matrix * __thiscall LUPMatrix::GetMatrix(Matrix *__return_storage_ptr__,LUPMatrix *this)

{
  Permutation local_70;
  Matrix local_58;
  Matrix local_38;
  LUPMatrix *local_18;
  LUPMatrix *this_local;
  
  local_18 = this;
  this_local = (LUPMatrix *)__return_storage_ptr__;
  Permutation::GetInverse(&local_70,&this->row_permutation_);
  operator*(&local_58,&local_70,&this->l_);
  operator*(&local_38,&local_58,&this->u_);
  operator*(__return_storage_ptr__,&local_38,&this->column_permutation_);
  Matrix::~Matrix(&local_38);
  Matrix::~Matrix(&local_58);
  Permutation::~Permutation(&local_70);
  return __return_storage_ptr__;
}

Assistant:

Matrix LUPMatrix::GetMatrix() const {
  return row_permutation_.GetInverse() * l_ * u_ * column_permutation_;
}